

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zx7.h
# Opt level: O0

uchar * ZX7_compress(Optimal *optimal,uchar *input_data,size_t input_size,size_t *output_size)

{
  int value;
  uint uVar1;
  int local_54;
  int local_44;
  uint local_40;
  int i;
  int mask;
  int offset1;
  size_t input_prev;
  size_t input_index;
  size_t *output_size_local;
  size_t input_size_local;
  uchar *input_data_local;
  Optimal *optimal_local;
  
  input_prev = input_size - 1;
  *output_size = optimal[input_prev].bits + 0x19 >> 3;
  output_data = (uchar *)malloc(*output_size);
  optimal[input_prev].bits = 0;
  while (input_prev != 0) {
    if (optimal[input_prev].len < 1) {
      local_54 = 1;
    }
    else {
      local_54 = optimal[input_prev].len;
    }
    optimal[input_prev - (long)local_54].bits = input_prev;
    input_prev = input_prev - (long)local_54;
  }
  output_index = 0;
  bit_mask = 0;
  write_byte((uint)*input_data);
  while (input_prev = optimal[input_prev].bits, input_prev != 0) {
    if (optimal[input_prev].len == 0) {
      write_bit(0);
      write_byte((uint)input_data[input_prev]);
    }
    else {
      write_bit(1);
      write_elias_gamma(optimal[input_prev].len + -1);
      value = optimal[input_prev].offset + -1;
      if (value < 0x80) {
        write_byte(value);
      }
      else {
        uVar1 = optimal[input_prev].offset - 0x81;
        write_byte(uVar1 & 0x7f | 0x80);
        for (local_40 = 0x400; 0x7f < local_40; local_40 = (int)local_40 >> 1) {
          write_bit(uVar1 & local_40);
        }
      }
    }
  }
  write_bit(1);
  for (local_44 = 0; local_44 < 0x10; local_44 = local_44 + 1) {
    write_bit(0);
  }
  write_bit(1);
  return output_data;
}

Assistant:

unsigned char *ZX7_compress(Optimal *optimal, unsigned char *input_data, size_t input_size, size_t *output_size) {
    size_t input_index;
    size_t input_prev;
    int offset1;
    int mask;
    int i;

    /* calculate and allocate output buffer */
    input_index = input_size-1;
    *output_size = (optimal[input_index].bits+18+7)/8;
    output_data = (unsigned char *)MemMalloc(*output_size);

    /* un-reverse optimal sequence */
    optimal[input_index].bits = 0;
    while (input_index > 0) {
        input_prev = input_index - (optimal[input_index].len > 0 ? optimal[input_index].len : 1);
        optimal[input_prev].bits = input_index;
        input_index = input_prev;
    }

    output_index = 0;
    bit_mask = 0;

    /* first byte is always literal */
    write_byte(input_data[0]);

    /* process remaining bytes */
    while ((input_index = optimal[input_index].bits) > 0) {
        if (optimal[input_index].len == 0) {

            /* literal indicator */
            write_bit(0);

            /* literal value */
            write_byte(input_data[input_index]);

        } else {

            /* sequence indicator */
            write_bit(1);

            /* sequence length */
            write_elias_gamma(optimal[input_index].len-1);

            /* sequence offset */
            offset1 = optimal[input_index].offset-1;
            if (offset1 < 128) {
                write_byte(offset1);
            } else {
                offset1 -= 128;
                write_byte((offset1 & 127) | 128);
                for (mask = 1024; mask > 127; mask >>= 1) {
                    write_bit(offset1 & mask);
                }
            }
        }
    }

    /* sequence indicator */
    write_bit(1);

    /* end marker > MAX_LEN */
    for (i = 0; i < 16; i++) {
        write_bit(0);
    }
    write_bit(1);

    return output_data;
}